

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

void __thiscall adios2::IO::ClearParameters(IO *this)

{
  IO *pointer;
  allocator local_39;
  string local_38;
  
  pointer = this->m_IO;
  std::__cxx11::string::string((string *)&local_38,"in call to IO::ClearParameters",&local_39);
  helper::CheckForNullptr<adios2::core::IO>(pointer,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  adios2::core::IO::ClearParameters();
  return;
}

Assistant:

void IO::ClearParameters()
{
    helper::CheckForNullptr(m_IO, "in call to IO::ClearParameters");
    m_IO->ClearParameters();
}